

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedEnergyFirePdu.cpp
# Opt level: O0

void __thiscall
DIS::DirectedEnergyFirePdu::marshal(DirectedEnergyFirePdu *this,DataStream *dataStream)

{
  pointer pSVar1;
  size_type sVar2;
  pointer pSVar3;
  const_reference pvVar4;
  undefined1 local_48 [8];
  StandardVariableSpecification x;
  size_t idx;
  DataStream *dataStream_local;
  DirectedEnergyFirePdu *this_local;
  
  WarfareFamilyPdu::marshal(&this->super_WarfareFamilyPdu,dataStream);
  EntityType::marshal(&this->_munitionType,dataStream);
  ClockTime::marshal(&this->_shotStartTime,dataStream);
  DataStream::operator<<(dataStream,this->_commulativeShotTime);
  Vector3Float::marshal(&this->_ApertureEmitterLocation,dataStream);
  DataStream::operator<<(dataStream,this->_apertureDiameter);
  DataStream::operator<<(dataStream,this->_wavelength);
  DataStream::operator<<(dataStream,this->_peakIrradiance);
  DataStream::operator<<(dataStream,this->_pulseRepetitionFrequency);
  DataStream::operator<<(dataStream,this->_pulseWidth);
  DataStream::operator<<(dataStream,this->_flags);
  DataStream::operator<<(dataStream,this->_pulseShape);
  DataStream::operator<<(dataStream,this->_padding1);
  DataStream::operator<<(dataStream,this->_padding2);
  DataStream::operator<<(dataStream,this->_padding3);
  sVar2 = std::
          vector<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
          ::size(&this->_dERecords);
  DataStream::operator<<(dataStream,(unsigned_short)sVar2);
  x._standardVariables.
  super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pSVar1 = x._standardVariables.
             super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pSVar3 = (pointer)std::
                      vector<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
                      ::size(&this->_dERecords);
    if (pSVar3 <= pSVar1) break;
    pvVar4 = std::
             vector<DIS::StandardVariableSpecification,_std::allocator<DIS::StandardVariableSpecification>_>
             ::operator[](&this->_dERecords,
                          (size_type)
                          x._standardVariables.
                          super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    StandardVariableSpecification::StandardVariableSpecification
              ((StandardVariableSpecification *)local_48,pvVar4);
    StandardVariableSpecification::marshal((StandardVariableSpecification *)local_48,dataStream);
    StandardVariableSpecification::~StandardVariableSpecification
              ((StandardVariableSpecification *)local_48);
    x._standardVariables.
    super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(x._standardVariables.
                           super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          _vptr_SimulationManagementPduHeader + 1);
  }
  return;
}

Assistant:

void DirectedEnergyFirePdu::marshal(DataStream& dataStream) const
{
    WarfareFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _munitionType.marshal(dataStream);
    _shotStartTime.marshal(dataStream);
    dataStream << _commulativeShotTime;
    _ApertureEmitterLocation.marshal(dataStream);
    dataStream << _apertureDiameter;
    dataStream << _wavelength;
    dataStream << _peakIrradiance;
    dataStream << _pulseRepetitionFrequency;
    dataStream << _pulseWidth;
    dataStream << _flags;
    dataStream << _pulseShape;
    dataStream << _padding1;
    dataStream << _padding2;
    dataStream << _padding3;
    dataStream << ( unsigned short )_dERecords.size();

     for(size_t idx = 0; idx < _dERecords.size(); idx++)
     {
        StandardVariableSpecification x = _dERecords[idx];
        x.marshal(dataStream);
     }

}